

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

char * flatcc_json_parser_integer
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value)

{
  byte *pbVar1;
  uint uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  
  if (buf != end) {
    uVar6 = (ulong)(*buf == '-');
    uVar5 = (uint)(*buf == '-');
    *value_sign = uVar5;
    uVar2 = ~(uint)buf;
    uVar9 = 0;
    uVar7 = 0;
    for (pcVar8 = buf; pbVar1 = (byte *)(pcVar8 + uVar6), pbVar1 != (byte *)end; pcVar8 = pcVar8 + 1
        ) {
      bVar4 = *pbVar1 - 0x30;
      if (9 < bVar4) {
        if (uVar6 == uVar9) {
          return buf;
        }
        uVar10 = *pbVar1 - 0x2e;
        if ((uVar10 < 0x38) && ((0x80000000800001U >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
          if (ctx->error != 0) {
            return end;
          }
          ctx->error = 0xc;
          ctx->pos = (uVar5 - *(int *)&ctx->line_start) - uVar2;
          ctx->error_loc = (char *)pbVar1;
          return end;
        }
        goto LAB_0011065c;
      }
      uVar3 = (ulong)bVar4 + uVar7 * 10;
      if (uVar3 < uVar7) {
        if (ctx->error != 0) {
          return end;
        }
        ctx->error = 8;
        ctx->pos = (uVar5 - *(int *)&ctx->line_start) - uVar2;
        ctx->error_loc = pcVar8 + uVar6;
        return end;
      }
      uVar9 = uVar9 - 1;
      uVar2 = uVar2 - 1;
      uVar7 = uVar3;
    }
    pbVar1 = (byte *)end;
    if (end != buf) {
LAB_0011065c:
      buf = (char *)pbVar1;
      *value = uVar7;
    }
  }
  return buf;
}

Assistant:

const char *flatcc_json_parser_integer(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value)
{
    uint64_t x0, x = 0;
    const char *k;

    if (buf == end) {
        return buf;
    }
    k = buf;
    *value_sign = *buf == '-';
    buf += *value_sign;
    while (buf != end && *buf >= '0' && *buf <= '9') {
        x0 = x;
        x = x * 10 + (uint64_t)(*buf - '0');
        if (x0 > x) {
            return flatcc_json_parser_set_error(ctx, buf, end, value_sign ?
                    flatcc_json_parser_error_underflow : flatcc_json_parser_error_overflow);
        }
        ++buf;
    }
    if (buf == k) {
        /* Give up, but don't fail the parse just yet, it might be a valid symbol. */
        return buf;
    }
    if (buf != end && (*buf == 'e' || *buf == 'E' || *buf == '.')) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_float_unexpected);
    }
    *value = x;
    return buf;
}